

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreecheck(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  u8 uVar1;
  ushort uVar2;
  uint uVar3;
  sqlite3 *db;
  int iVar4;
  Vdbe *pVm;
  char *pcVar5;
  char *pcVar6;
  sqlite3_stmt *psVar7;
  Mem *pMVar8;
  char *pcVar9;
  Vdbe *pVm_1;
  RtreeCheck local_88;
  
  if (nArg - 3U < 0xfffffffe) {
    ctx->isError = 1;
    sqlite3VdbeMemSetStr
              (ctx->pOut,"wrong number of arguments to function rtreecheck()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  pcVar5 = (char *)sqlite3ValueText(*apArg,'\x01');
  if (nArg == 1) {
    pcVar9 = "main";
    pcVar6 = pcVar5;
  }
  else {
    pcVar6 = (char *)sqlite3ValueText(apArg[1],'\x01');
    pcVar9 = pcVar5;
  }
  db = ctx->pOut->db;
  local_88.bInt = 0;
  local_88.nDim = 0;
  local_88._64_8_ = 0;
  local_88.zReport = (char *)0x0;
  local_88.aCheckMapping[1] = (sqlite3_stmt *)0x0;
  local_88.nLeaf = 0;
  local_88.nNonLeaf = 0;
  local_88.pGetNode = (sqlite3_stmt *)0x0;
  local_88.aCheckMapping[0] = (sqlite3_stmt *)0x0;
  local_88.nErr = 0;
  local_88._84_4_ = 0;
  uVar1 = db->autoCommit;
  local_88.db = db;
  local_88.zDb = pcVar9;
  local_88.zTab = pcVar6;
  if (uVar1 != '\0') {
    iVar4 = sqlite3_exec(db,"BEGIN",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    local_88.rc = iVar4;
  }
  iVar4 = -1;
  if (local_88.rc == 0) {
    psVar7 = rtreeCheckPrepare(&local_88,"SELECT * FROM %Q.\'%q_rowid\'",pcVar9,pcVar6);
    if (psVar7 == (sqlite3_stmt *)0x0) {
      iVar4 = -1;
    }
    else {
      uVar2 = *(ushort *)(psVar7 + 0xc0);
      sqlite3_finalize(psVar7);
      iVar4 = 1 - (uint)uVar2;
    }
    local_88._64_8_ = local_88._64_8_ & 0xffffffff00000000;
  }
  psVar7 = rtreeCheckPrepare(&local_88,"SELECT * FROM %Q.%Q",pcVar9);
  if (psVar7 != (sqlite3_stmt *)0x0) {
    local_88.nDim = (int)(iVar4 + (uint)*(ushort *)(psVar7 + 0xc0)) / 2;
    if ((int)(iVar4 + (uint)*(ushort *)(psVar7 + 0xc0)) < 2) {
      rtreeCheckAppendMsg(&local_88,"Schema corrupt or not an rtree");
    }
    else {
      iVar4 = sqlite3_step(psVar7);
      if (iVar4 == 100) {
        pMVar8 = columnMem(psVar7,1);
        uVar3._0_2_ = pMVar8->flags;
        uVar3._2_1_ = pMVar8->enc;
        uVar3._3_1_ = pMVar8->eSubtype;
        columnMallocFailure(psVar7);
        local_88.bInt = (int)((0x50505050U >> (uVar3 & 0x1f) & 1) != 0);
      }
    }
    iVar4 = sqlite3_finalize(psVar7);
    if (iVar4 != 0xb) {
      local_88.rc = iVar4;
    }
  }
  if (0 < local_88.nDim) {
    if (local_88.rc == 0) {
      rtreeCheckNode(&local_88,0,(u8 *)0x0,1);
    }
    rtreeCheckCount(&local_88,"_rowid",(long)local_88.nLeaf);
    rtreeCheckCount(&local_88,"_parent",(long)local_88.nNonLeaf);
  }
  sqlite3_finalize(local_88.pGetNode);
  sqlite3_finalize(local_88.aCheckMapping[0]);
  sqlite3_finalize(local_88.aCheckMapping[1]);
  if (uVar1 != '\0') {
    iVar4 = sqlite3_exec(db,"END",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
    if (local_88.rc != 0) {
      iVar4 = local_88.rc;
    }
    local_88.rc = iVar4;
  }
  pcVar5 = local_88.zReport;
  if (local_88.rc == 0) {
    pcVar9 = "ok";
    if (local_88.zReport != (char *)0x0) {
      pcVar9 = local_88.zReport;
    }
    setResultStrOrError(ctx,pcVar9,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(ctx,local_88.rc);
  }
  sqlite3_free(pcVar5);
  return;
}

Assistant:

static void rtreecheck(
  sqlite3_context *ctx, 
  int nArg, 
  sqlite3_value **apArg
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(ctx, 
        "wrong number of arguments to function rtreecheck()", -1
    );
  }else{
    int rc;
    char *zReport = 0;
    const char *zDb = (const char*)sqlite3_value_text(apArg[0]);
    const char *zTab;
    if( nArg==1 ){
      zTab = zDb;
      zDb = "main";
    }else{
      zTab = (const char*)sqlite3_value_text(apArg[1]);
    }
    rc = rtreeCheckTable(sqlite3_context_db_handle(ctx), zDb, zTab, &zReport);
    if( rc==SQLITE_OK ){
      sqlite3_result_text(ctx, zReport ? zReport : "ok", -1, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_error_code(ctx, rc);
    }
    sqlite3_free(zReport);
  }
}